

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains_range_closed
                (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  _Bool _Var1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  int32_t iVar7;
  container_t *pcVar8;
  uint in_EDX;
  uint in_ESI;
  roaring_array_t *in_RDI;
  int32_t i;
  container_t *c;
  uint8_t type;
  uint32_t lb_re;
  uint32_t lb_rs;
  int32_t ie;
  int32_t is;
  int32_t hlc_sz;
  int32_t span;
  uint16_t hb_re;
  uint16_t hb_rs;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint8_t typecode;
  undefined8 in_stack_ffffffffffffffc0;
  uint32_t range_start_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  _Bool local_1;
  
  if (in_EDX < in_ESI) {
    local_1 = true;
  }
  else if (in_EDX == in_ESI) {
    local_1 = roaring_bitmap_contains
                        ((roaring_bitmap_t *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  }
  else {
    uVar2 = (ushort)(in_ESI >> 0x10);
    uVar3 = (ushort)(in_EDX >> 0x10);
    iVar4 = (uint)uVar3 - (uint)uVar2;
    iVar5 = ra_get_size(in_RDI);
    if (iVar5 < iVar4 + 1) {
      local_1 = false;
    }
    else {
      iVar6 = ra_get_index((roaring_array_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      iVar7 = ra_get_index((roaring_array_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      typecode = (uint8_t)((uint)in_stack_ffffffffffffffbc >> 0x18);
      if ((((iVar7 < 0) || (iVar6 < 0)) || (iVar7 - iVar6 != iVar4)) || (iVar5 <= iVar7)) {
        local_1 = false;
      }
      else {
        iVar4 = (in_EDX & 0xffff) + 1;
        pcVar8 = ra_get_container_at_index(in_RDI,(uint16_t)iVar6,&stack0xffffffffffffffcb);
        range_start_00 = (uint32_t)((ulong)pcVar8 >> 0x20);
        if (uVar2 == uVar3) {
          local_1 = container_contains_range
                              ((container_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                               range_start_00,(uint32_t)pcVar8,typecode);
        }
        else {
          _Var1 = container_contains_range
                            ((container_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),range_start_00
                             ,(uint32_t)pcVar8,typecode);
          if (_Var1) {
            pcVar8 = ra_get_container_at_index(in_RDI,(uint16_t)iVar7,&stack0xffffffffffffffcb);
            _Var1 = container_contains_range
                              ((container_t *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                               (uint32_t)((ulong)pcVar8 >> 0x20),(uint32_t)pcVar8,typecode);
            if (_Var1) {
              do {
                iVar6 = iVar6 + 1;
                if (iVar7 <= iVar6) {
                  return true;
                }
                ra_get_container_at_index(in_RDI,(uint16_t)iVar6,&stack0xffffffffffffffcb);
                _Var1 = container_is_full((container_t *)CONCAT44(iVar6,in_stack_ffffffffffffffb8),
                                          '\0');
              } while (_Var1);
              local_1 = false;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_contains_range_closed(const roaring_bitmap_t *r,
                                          uint32_t range_start,
                                          uint32_t range_end) {
    if (range_start > range_end) {
        return true;
    }  // empty range are always contained!
    if (range_end == range_start) {
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    }
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)(range_end >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = (range_end & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}